

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::end
          (QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *this)

{
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *n;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
  *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *)0x8a9799);
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::operator->
            (in_RDI);
  n = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::end
                (in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }